

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

Addr deref(Machine *m,Addr a)

{
  Addr a_00;
  Addr AVar1;
  bool bVar2;
  Addr a_01;
  Machine local_150;
  Machine local_e0;
  Addr local_6c;
  undefined1 local_60 [8];
  Hcell hc;
  
  hc.f_._32_8_ = a._0_8_;
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)&local_150,
             (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)m);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::_Rb_tree(&local_150.regval._M_t,&(m->regval)._M_t);
  local_150.mode = m->mode;
  local_150.h.hix = (m->h).hix;
  local_150.s.hix = (m->s).hix;
  a_00.hix_.hix = a.hix_.hix.hix;
  a_00.tag_ = hc.f_.arity;
  a_00.r_.r = hc.f_._36_4_;
  machineAtAddr((Hcell *)local_60,&local_150,a_00);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&local_150.regval._M_t);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)&local_150);
  if (local_60._0_4_ == Ref) {
    local_6c.tag_ = Heap;
    local_6c.r_.r = -0x2a;
    local_6c.hix_.hix = local_60._4_4_;
    bVar2 = Addr::operator==(&local_6c,(Addr *)&hc.f_.arity);
    if (!bVar2) {
      std::
      _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
      ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                  *)&local_e0,
                 (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                  *)m);
      std::
      _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
      ::_Rb_tree(&local_e0.regval._M_t,&(m->regval)._M_t);
      local_e0.mode = m->mode;
      local_e0.h.hix = (m->h).hix;
      local_e0.s.hix = (m->s).hix;
      if (Str < (uint)local_60._0_4_) {
        __assert_fail("tag == Htag::Ref || tag == Htag::Str",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                      ,0x7b,"Hix Hcell::hix() const");
      }
      a_01.hix_.hix = local_60._4_4_;
      a_01.tag_ = Heap;
      a_01.r_.r = -0x2a;
      deref(&local_e0,a_01);
      std::
      _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
      ::~_Rb_tree(&local_e0.regval._M_t);
      std::
      _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
      ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                   *)&local_e0);
    }
  }
  AVar1.hix_.hix = a.hix_.hix.hix;
  AVar1.tag_ = hc.f_.arity;
  AVar1.r_.r = hc.f_._36_4_;
  if ((size_type *)hc._0_8_ != &hc.f_.id._M_string_length) {
    operator_delete((void *)hc._0_8_,hc.f_.id._M_string_length + 1);
  }
  return AVar1;
}

Assistant:

Addr deref(Machine m, Addr a) {
    const Hcell hc = machineAtAddr(m, a);
    // if we have a reference to chase which is not pointing to itself, then
    // chase it
    if (hc.tag == Htag::Ref && Addr(hc.hix()) != a) {
        deref(m, hc.hix());
    }
    return a;
}